

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitImEa<(moira::Instr)29,(moira::Mode)6,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  Ea<(moira::Mode)6,_1> dst;
  Ea<(moira::Mode)6,_1> local_3c;
  
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)6,1>(&local_3c,this,op & 7,addr);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar4 = 'b';
    lVar6 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "bset"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar5);
  }
  else {
    cVar4 = 'b';
    lVar6 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "bset"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    StrWriter::operator<<(str,(UInt)(uVar5 & 0xff));
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,&local_3c);
  return;
}

Assistant:

void
Moira::dasmBitImEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<S>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu<S>(src) << Sep{} << dst;
    }
}